

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void outtab_stream(out_stream_info *stream)

{
  byte bVar1;
  long in_RDI;
  int maxcol;
  char in_stack_0000280f;
  out_stream_info *in_stack_00002810;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  bool bVar2;
  undefined4 in_stack_fffffffffffffff0;
  int iVar3;
  undefined4 in_stack_fffffffffffffff4;
  
  if (*(int *)(in_RDI + 0x2844) == 0) {
    iVar3 = G_os_linewidth;
    if (*(int *)(in_RDI + 0x2840) != 0) {
      iVar3 = 0x800;
    }
    do {
      *(undefined4 *)(in_RDI + 0x810 + (ulong)*(byte *)(in_RDI + 8) * 4) =
           *(undefined4 *)(in_RDI + 0x2810);
      bVar1 = *(byte *)(in_RDI + 8);
      *(byte *)(in_RDI + 8) = bVar1 + 1;
      *(undefined1 *)(in_RDI + 0x10 + (ulong)bVar1) = 0x20;
      *(char *)(in_RDI + 9) = *(char *)(in_RDI + 9) + '\x01';
      bVar2 = false;
      if ((*(char *)(in_RDI + 9) + 1U & 3) != 0) {
        bVar2 = (int)(uint)*(byte *)(in_RDI + 9) < iVar3;
      }
    } while (bVar2);
  }
  else if (*(int *)(in_RDI + 0x284c) == 0) {
    outchar_noxlat_stream(in_stack_00002810,in_stack_0000280f);
  }
  else {
    outstring_stream((out_stream_info *)
                     CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                     (char *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
  }
  return;
}

Assistant:

static void outtab_stream(out_stream_info *stream)
{
    /* check to see what the underlying system is expecting */
    if (stream->html_target)
    {
        /* the underlying system is HTML - check for HTML mode */
        if (stream->html_mode)
        {
            /* we're in HTML mode, so use the HTML <TAB> tag */
            outstring_stream(stream, "<TAB MULTIPLE=4>");
        }
        else
        {
            /* we're not in HTML mode, so generate a hard tab character */
            outchar_noxlat_stream(stream, QTAB);
        }
    }
    else
    {
        int maxcol;

        /* 
         *   We're not in HTML mode - expand the tab with spaces.  Figure
         *   the maximum column: if we're doing our own line wrapping, never
         *   go beyond the actual display width. 
         */
        maxcol = (stream->os_line_wrap ? OS_MAXWIDTH : G_os_linewidth);

        /* add the spaces */
        do
        {
            stream->attrbuf[stream->linepos] = stream->cur_attr;
            stream->linebuf[stream->linepos++] = ' ';
            ++(stream->linecol);
        } while (((stream->linecol + 1) & 3) != 0
                 && stream->linecol < maxcol);
    }
}